

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O2

void opj_write_float_LE(OPJ_BYTE *p_buffer,OPJ_FLOAT32 p_value)

{
  long lVar1;
  OPJ_FLOAT32 p_value_local;
  
  for (lVar1 = 3; (int)lVar1 != -1; lVar1 = lVar1 + -1) {
    *p_buffer = *(OPJ_BYTE *)((long)&p_value_local + lVar1);
    p_buffer = p_buffer + 1;
  }
  return;
}

Assistant:

void opj_write_float_LE(OPJ_BYTE * p_buffer, OPJ_FLOAT32 p_value)
{
    const OPJ_BYTE * l_data_ptr = ((const OPJ_BYTE *) &p_value) + sizeof(
                                      OPJ_FLOAT32) - 1;
    OPJ_UINT32 i;
    for (i = 0; i < sizeof(OPJ_FLOAT32); ++i) {
        *(p_buffer++) = *(l_data_ptr--);
    }
}